

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  undefined1 local_48 [56];
  AssertionPrinter *pAStack_10;
  Colour colourGuard;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar2 = AssertionResult::hasExpression(this->result);
  if (bVar2) {
    Colour::Colour((Colour *)(local_48 + 0x37),Cyan);
    std::operator<<((ostream *)this->stream,"  ");
    poVar1 = (ostream *)this->stream;
    AssertionResult::getExpressionInMacro_abi_cxx11_((AssertionResult *)local_48);
    std::operator<<(poVar1,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::operator<<((ostream *)this->stream,"\n");
    Colour::~Colour((Colour *)(local_48 + 0x37));
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    Colour colourGuard( Colour::OriginalExpression );
                    stream  << "  ";
                    stream << result.getExpressionInMacro();
                    stream << "\n";
                }
            }